

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioBrokerServer.cpp
# Opt level: O1

void __thiscall
helics::udp::UdpServer::UdpServer
          (UdpServer *this,io_context *io_context,string_view interface,uint16_t portNum)

{
  socket *this_00;
  long *str;
  socklen_t *psVar1;
  undefined8 *puVar2;
  int __oflag;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  ushort uVar3;
  error_code __ec;
  bad_address_cast ex;
  undefined8 local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  socklen_t local_b0 [4];
  long *local_a0 [2];
  long local_90 [2];
  undefined **local_80 [4];
  address local_5c;
  error_code local_40;
  
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<helics::udp::UdpServer>)._M_weak_this.
  super___weak_ptr<helics::udp::UdpServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = &this->mSocket;
  ::asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>::
  io_object_impl<asio::io_context>
            ((io_object_impl<asio::detail::reactive_socket_service<asio::ip::udp>,_asio::any_io_executor>
              *)this_00,0,0,io_context);
  *(undefined8 *)&(this->mRemoteEndpoint).impl_.data_ = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 8) = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 0xc) = 0;
  *(undefined8 *)((long)&(this->mRemoteEndpoint).impl_.data_ + 0x14) = 0;
  *(undefined8 *)&(this->mRemoteEndpoint).impl_.data_ = 2;
  memset(&this->mRecvBuffer,0,0x400);
  *(undefined8 *)&(this->mDataCall).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->mDataCall).super__Function_base._M_functor + 8) = 0;
  (this->mDataCall).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->mDataCall)._M_invoker = (_Invoker_type)0x0;
  local_80[0] = (undefined **)CONCAT44(local_80[0]._4_4_,2);
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::open
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(char *)local_80,
             __oflag);
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,interface._M_str,interface._M_str + interface._M_len);
  str = local_a0[0];
  local_40._M_value = 0;
  local_40._M_cat = (error_category *)std::_V2::system_category();
  ::asio::ip::make_address(&local_5c,(char *)str,&local_40);
  __ec._4_4_ = 0;
  __ec._M_value = local_40._M_value;
  __addr = extraout_RDX;
  if (local_40._M_value != 0) {
    __ec._M_cat = local_40._M_cat;
    std::system_error::system_error((system_error *)local_80,__ec);
    ::asio::detail::throw_exception<std::system_error>((system_error *)local_80);
    std::system_error::~system_error((system_error *)local_80);
    __addr = extraout_RDX_00;
  }
  uStack_c0 = 0;
  uStack_bc = 0;
  uStack_b8 = 0;
  uStack_b4 = 0;
  local_b0[0] = 0;
  uVar3 = portNum << 8 | portNum >> 8;
  if (local_5c.type_ == ipv4) {
    psVar1 = (socklen_t *)((long)&local_c8 + 4);
    local_c8._0_4_ = CONCAT22(uVar3,2);
    local_c8 = (ulong)(uint)local_c8;
    local_5c.ipv6_address_.scope_id_ = (scope_id_type)local_5c.ipv4_address_.addr_.s_addr;
  }
  else {
    local_c8._0_4_ = CONCAT22(uVar3,10);
    local_c8 = (ulong)(uint)local_c8;
    if (local_5c.type_ != ipv6) {
      local_80[0] = &PTR__bad_cast_0054f738;
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = &PTR__bad_cast_0054f738;
      __cxa_throw(puVar2,&::asio::ip::bad_address_cast::typeinfo,std::bad_cast::~bad_cast);
    }
    psVar1 = local_b0;
    uStack_c0 = (undefined4)local_5c.ipv6_address_.addr_.__in6_u._0_8_;
    uStack_bc = (undefined4)((ulong)local_5c.ipv6_address_.addr_.__in6_u._0_8_ >> 0x20);
    uStack_b8 = (undefined4)local_5c.ipv6_address_.addr_.__in6_u._8_8_;
    uStack_b4 = (undefined4)((ulong)local_5c.ipv6_address_.addr_.__in6_u._8_8_ >> 0x20);
  }
  *psVar1 = local_5c.ipv6_address_.scope_id_;
  ::asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::bind
            (&this_00->super_basic_socket<asio::ip::udp,_asio::any_io_executor>,(int)&local_c8,
             __addr,local_5c.ipv6_address_.scope_id_);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  return;
}

Assistant:

UdpServer(asio::io_context& io_context, std::string_view interface, std::uint16_t portNum):
            mSocket(io_context)
        {
            mSocket.open(asio::ip::udp::v4());
            mSocket.bind(
                asio::ip::udp::endpoint(asio::ip::address::from_string(std::string(interface)),
                                        portNum));
        }